

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

void __thiscall foxxll::file::~file(file *this)

{
  Logger *pLVar1;
  Logger local_198;
  LoggerVoidify local_19;
  size_t local_18;
  size_t nr;
  file *this_local;
  
  this->_vptr_file = (_func_int **)&PTR___cxa_pure_virtual_001e40a8;
  nr = (size_t)this;
  local_18 = get_request_nref(this);
  if (local_18 != 0) {
    tlx::Logger::Logger(&local_198);
    pLVar1 = tlx::Logger::operator<<
                       (&local_198,
                        (char (*) [53])"foxxll::file is being deleted while there are still ");
    pLVar1 = tlx::Logger::operator<<(pLVar1,&local_18);
    pLVar1 = tlx::Logger::operator<<(pLVar1,(char (*) [38])" (unfinished) requests referencing it");
    tlx::LoggerVoidify::operator&(&local_19,pLVar1);
    tlx::Logger::~Logger(&local_198);
  }
  tlx::ReferenceCounter::~ReferenceCounter(&this->request_ref_);
  tlx::ReferenceCounter::~ReferenceCounter(&this->super_reference_counter);
  return;
}

Assistant:

virtual ~file()
    {
        const size_t nr = get_request_nref();
        if (nr != 0) {
            TLX_LOG1 << "foxxll::file is being deleted while there are still "
                     << nr << " (unfinished) requests referencing it";
        }
    }